

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpattern.cc
# Opt level: O0

Pattern * __thiscall OrPattern::doAnd(OrPattern *this,Pattern *b,int4 sa)

{
  DisjointPattern *pDVar1;
  bool bVar2;
  int iVar3;
  reference ppDVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  OrPattern *this_00;
  long local_b8;
  __normal_iterator<DisjointPattern_*const_*,_std::vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>_>
  local_a0;
  DisjointPattern **local_98;
  __normal_iterator<DisjointPattern_*const_*,_std::vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>_>
  local_90;
  DisjointPattern **local_88;
  __normal_iterator<DisjointPattern_*const_*,_std::vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>_>
  local_70;
  DisjointPattern **local_68;
  OrPattern *local_60;
  OrPattern *tmpor;
  DisjointPattern *tmp;
  const_iterator iter2;
  const_iterator iter;
  vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_> newlist;
  OrPattern *b2;
  int4 sa_local;
  Pattern *b_local;
  OrPattern *this_local;
  
  if (b == (Pattern *)0x0) {
    local_b8 = 0;
  }
  else {
    local_b8 = __dynamic_cast(b,&Pattern::typeinfo,&typeinfo,0);
  }
  std::vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>::vector
            ((vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_> *)&iter);
  __gnu_cxx::
  __normal_iterator<DisjointPattern_*const_*,_std::vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>_>
  ::__normal_iterator(&iter2);
  __gnu_cxx::
  __normal_iterator<DisjointPattern_*const_*,_std::vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>_>
  ::__normal_iterator((__normal_iterator<DisjointPattern_*const_*,_std::vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>_>
                       *)&tmp);
  if (local_b8 == 0) {
    local_68 = (DisjointPattern **)
               std::vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>::begin
                         (&this->orlist);
    iter2 = (const_iterator)local_68;
    while( true ) {
      local_70._M_current =
           (DisjointPattern **)
           std::vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>::end(&this->orlist);
      bVar2 = __gnu_cxx::operator!=(&iter2,&local_70);
      if (!bVar2) break;
      ppDVar4 = __gnu_cxx::
                __normal_iterator<DisjointPattern_*const_*,_std::vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>_>
                ::operator*(&iter2);
      iVar3 = (*((*ppDVar4)->super_Pattern)._vptr_Pattern[5])(*ppDVar4,b,(ulong)(uint)sa);
      tmpor = (OrPattern *)CONCAT44(extraout_var,iVar3);
      std::vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>::push_back
                ((vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_> *)&iter,
                 (value_type *)&tmpor);
      __gnu_cxx::
      __normal_iterator<DisjointPattern_*const_*,_std::vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>_>
      ::operator++(&iter2);
    }
  }
  else {
    local_88 = (DisjointPattern **)
               std::vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>::begin
                         (&this->orlist);
    iter2 = (const_iterator)local_88;
    while( true ) {
      local_90._M_current =
           (DisjointPattern **)
           std::vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>::end(&this->orlist);
      bVar2 = __gnu_cxx::operator!=(&iter2,&local_90);
      if (!bVar2) break;
      local_98 = (DisjointPattern **)
                 std::vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>::begin
                           ((vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_> *)
                            (local_b8 + 8));
      tmp = (DisjointPattern *)local_98;
      while( true ) {
        local_a0._M_current =
             (DisjointPattern **)
             std::vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>::end
                       ((vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_> *)
                        (local_b8 + 8));
        bVar2 = __gnu_cxx::operator!=
                          ((__normal_iterator<DisjointPattern_*const_*,_std::vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>_>
                            *)&tmp,&local_a0);
        if (!bVar2) break;
        ppDVar4 = __gnu_cxx::
                  __normal_iterator<DisjointPattern_*const_*,_std::vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>_>
                  ::operator*(&iter2);
        pDVar1 = *ppDVar4;
        ppDVar4 = __gnu_cxx::
                  __normal_iterator<DisjointPattern_*const_*,_std::vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>_>
                  ::operator*((__normal_iterator<DisjointPattern_*const_*,_std::vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>_>
                               *)&tmp);
        iVar3 = (*(pDVar1->super_Pattern)._vptr_Pattern[5])(pDVar1,*ppDVar4,(ulong)(uint)sa);
        tmpor = (OrPattern *)CONCAT44(extraout_var_00,iVar3);
        std::vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>::push_back
                  ((vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_> *)&iter,
                   (value_type *)&tmpor);
        __gnu_cxx::
        __normal_iterator<DisjointPattern_*const_*,_std::vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>_>
        ::operator++((__normal_iterator<DisjointPattern_*const_*,_std::vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>_>
                      *)&tmp);
      }
      __gnu_cxx::
      __normal_iterator<DisjointPattern_*const_*,_std::vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>_>
      ::operator++(&iter2);
    }
  }
  this_00 = (OrPattern *)operator_new(0x20);
  OrPattern(this_00,(vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_> *)&iter);
  local_60 = this_00;
  std::vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>::~vector
            ((vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_> *)&iter);
  return &this_00->super_Pattern;
}

Assistant:

Pattern *OrPattern::doAnd(const Pattern *b,int4 sa) const

{
  const OrPattern *b2 = dynamic_cast<const OrPattern *>(b);
  vector<DisjointPattern *> newlist;
  vector<DisjointPattern *>::const_iterator iter,iter2;
  DisjointPattern *tmp;
  OrPattern *tmpor;

  if (b2 == (const OrPattern *)0) {
    for(iter=orlist.begin();iter!=orlist.end();++iter) {
      tmp = (DisjointPattern *)(*iter)->doAnd(b,sa);
      newlist.push_back(tmp);
    }
  }
  else {
    for(iter=orlist.begin();iter!=orlist.end();++iter)
      for(iter2=b2->orlist.begin();iter2!=b2->orlist.end();++iter2) {
	tmp = (DisjointPattern *)(*iter)->doAnd(*iter2,sa);
	newlist.push_back(tmp);
      }
  }
  tmpor = new OrPattern(newlist);
  return tmpor;
}